

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O0

bool __thiscall CMU462::BSDF::refract(BSDF *this,Vector3D *wo,Vector3D *wi,float ior)

{
  float ior_local;
  Vector3D *wi_local;
  Vector3D *wo_local;
  BSDF *this_local;
  
  return true;
}

Assistant:

bool BSDF::refract(const Vector3D& wo, Vector3D* wi, float ior) {

    // TODO:
    // Use Snell's Law to refract wo surface and store result ray in wi.
    // Return false if refraction does not occur due to total internal reflection
    // and true otherwise. When dot(wo,n) is positive, then wo corresponds to a
    // ray entering the surface through vacuum.

    return true;

  }